

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightfield_tile_list_decoder.c
# Opt level: O0

void write_tile_yuv1d(aom_codec_ctx_t *codec,aom_image_t *img,FILE *file)

{
  aom_codec_err_t aVar1;
  int y;
  int h;
  int w;
  int coffset;
  int roffset;
  int stride;
  uchar *buf;
  int plane;
  int col_offset;
  int row_offset;
  uint tile_idx;
  int shift;
  uint tile_count;
  uint32_t output_frame_width_in_tiles;
  uint tile_height;
  uint tile_width;
  uint tile_size;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  aVar1 = aom_codec_control_typechecked_AV1D_GET_TILE_SIZE
                    ((aom_codec_ctx_t *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c,(uint *)0x11710f);
  if (aVar1 != AOM_CODEC_OK) {
    die_codec((aom_codec_ctx_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
              (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  aVar1 = aom_codec_control_typechecked_AV1D_GET_TILE_COUNT
                    ((aom_codec_ctx_t *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c,(uint *)0x11716b);
  if (aVar1 == AOM_CODEC_OK) {
    return;
  }
  die_codec((aom_codec_ctx_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
            (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
}

Assistant:

static void write_tile_yuv1d(aom_codec_ctx_t *codec, const aom_image_t *img,
                             FILE *file) {
  // read out the tile size.
  unsigned int tile_size = 0;
  if (AOM_CODEC_CONTROL_TYPECHECKED(codec, AV1D_GET_TILE_SIZE, &tile_size))
    die_codec(codec, "Failed to get the tile size");
  const unsigned int tile_width = tile_size >> 16;
  const unsigned int tile_height = tile_size & 65535;
  const uint32_t output_frame_width_in_tiles = img->d_w / tile_width;

  unsigned int tile_count = 0;
  if (AOM_CODEC_CONTROL_TYPECHECKED(codec, AV1D_GET_TILE_COUNT, &tile_count))
    die_codec(codec, "Failed to get the tile size");

  // Write tile to file.
  const int shift = (img->fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 1 : 0;
  unsigned int tile_idx;

  for (tile_idx = 0; tile_idx < tile_count; ++tile_idx) {
    const int row_offset =
        (tile_idx / output_frame_width_in_tiles) * tile_height;
    const int col_offset =
        (tile_idx % output_frame_width_in_tiles) * tile_width;
    int plane;

    for (plane = 0; plane < 3; ++plane) {
      const unsigned char *buf = img->planes[plane];
      const int stride = img->stride[plane];
      const int roffset =
          (plane > 0) ? row_offset >> img->y_chroma_shift : row_offset;
      const int coffset =
          (plane > 0) ? col_offset >> img->x_chroma_shift : col_offset;
      const int w = (plane > 0) ? ((tile_width >> img->x_chroma_shift) << shift)
                                : (tile_width << shift);
      const int h =
          (plane > 0) ? (tile_height >> img->y_chroma_shift) : tile_height;
      int y;

      // col offset needs to be adjusted for HBD.
      buf += roffset * stride + (coffset << shift);

      for (y = 0; y < h; ++y) {
        fwrite(buf, 1, w, file);
        buf += stride;
      }
    }
  }
}